

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O2

void __thiscall TPZAnalysis::Run(TPZAnalysis *this,ostream *out)

{
  int64_t iVar1;
  TPZSimpleTimer t;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  TPZSimpleTimer local_78;
  
  iVar1 = TPZCompMesh::NEquations(this->fCompMesh);
  if (20000 < iVar1) {
    std::operator<<((ostream *)&std::cout,"Entering Assemble Equations\n");
    std::ostream::flush();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Time for assembly",&local_b9);
  TPZSimpleTimer::TPZSimpleTimer(&local_78,&local_98,false);
  std::__cxx11::string::~string((string *)&local_98);
  (*(this->super_TPZSavable)._vptr_TPZSavable[9])(this);
  TPZSimpleTimer::~TPZSimpleTimer(&local_78);
  if (20000 < iVar1) {
    std::operator<<((ostream *)&std::cout,"Entering Solve\n");
    std::ostream::flush();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"Time for solving",&local_b9);
  TPZSimpleTimer::TPZSimpleTimer(&local_78,&local_b8,false);
  std::__cxx11::string::~string((string *)&local_b8);
  (*(this->super_TPZSavable)._vptr_TPZSavable[10])(this);
  TPZSimpleTimer::~TPZSimpleTimer(&local_78);
  return;
}

Assistant:

void TPZAnalysis::Run(std::ostream &out)
{
    int64_t neq = fCompMesh->NEquations();
    
    if(neq > 20000)
    {
        std::cout << "Entering Assemble Equations\n";
        std::cout.flush();
    }

    {
        TPZSimpleTimer t("Time for assembly");
        Assemble();
    }
    
    if(neq > 20000)
    {
        std::cout << "Entering Solve\n";
        std::cout.flush();
    }
    
    {
        TPZSimpleTimer t("Time for solving");
        Solve();
    }
}